

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O0

void av1_dist_wtd_convolve_y_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i *palVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  longlong lVar28;
  longlong lVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int in_ECX;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  __m128i *extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  __m128i *extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  __m128i *extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  __m128i *extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  undefined8 extraout_XMM0_Qa_19;
  undefined8 extraout_XMM0_Qa_20;
  undefined8 extraout_XMM0_Qa_21;
  undefined8 extraout_XMM0_Qa_22;
  undefined8 extraout_XMM0_Qa_23;
  __m128i *extraout_XMM0_Qb;
  __m128i *extraout_XMM0_Qb_00;
  __m128i *extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  long in_stack_00000008;
  int *in_stack_00000018;
  __m128i res_8_3;
  __m128i round_result_3;
  __m128i comp_avg_res_3;
  __m128i data_ref_0_3;
  __m128i res_8_2;
  __m128i round_result_2;
  __m128i comp_avg_res_2;
  __m128i data_ref_0_2;
  __m128i res_unsigned_1;
  __m128i res_16b_1;
  int i;
  uint8_t *data;
  __m128i res_hi_shift;
  __m128i res_lo_shift;
  __m128i res_hi;
  __m128i res_lo;
  __m128i src6_1;
  __m128i s_1 [8];
  int j;
  __m128i res_8_1;
  __m128i round_result_1;
  __m128i comp_avg_res_1;
  __m128i data_ref_0_1;
  __m128i res_8;
  __m128i round_result;
  __m128i comp_avg_res;
  __m128i data_ref_0;
  __m128i res_unsigned;
  __m128i res_16b;
  __m128i res_shift;
  __m128i res;
  __m128i src6;
  __m128i s [8];
  __m128i coeffs [4];
  __m128i round_shift;
  __m128i round_const;
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const;
  int offset;
  int offset_0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m128i wt;
  __m128i wt1;
  __m128i wt0;
  __m128i left_shift;
  int bits;
  uint8_t *src_ptr;
  int fo_vert;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  int bd;
  __m128i *in_stack_fffffffffffff1b8;
  __m128i *wt_00;
  __m128i *in_stack_fffffffffffff1c0;
  __m128i *res_unsigned_00;
  __m128i *in_stack_fffffffffffff1c8;
  __m128i *data_ref_0_00;
  undefined8 in_stack_fffffffffffff1d0;
  InterpFilterParams *in_stack_fffffffffffff1d8;
  undefined8 uVar32;
  __m128i *in_stack_fffffffffffff1f0;
  __m128i *coeffs_00;
  __m128i *in_stack_fffffffffffff1f8;
  __m128i *s_00;
  longlong local_db8 [2];
  undefined8 local_da8;
  undefined8 uStack_da0;
  char local_d98;
  char cStack_d97;
  char cStack_d96;
  char cStack_d95;
  char cStack_d94;
  char cStack_d93;
  char cStack_d92;
  char cStack_d91;
  char cStack_d90;
  char cStack_d8f;
  char cStack_d8e;
  char cStack_d8d;
  char cStack_d8c;
  char cStack_d8b;
  char cStack_d8a;
  char cStack_d89;
  longlong local_d78 [2];
  undefined8 local_d68;
  undefined8 uStack_d60;
  short local_d58;
  short sStack_d56;
  short sStack_d54;
  short sStack_d52;
  short sStack_d50;
  short sStack_d4e;
  short sStack_d4c;
  short sStack_d4a;
  undefined1 local_d48 [16];
  int local_d34;
  long local_d30;
  int local_d28;
  int iStack_d24;
  int iStack_d20;
  int iStack_d1c;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined1 local_c78;
  undefined1 uStack_c77;
  undefined1 uStack_c76;
  undefined1 uStack_c75;
  undefined1 uStack_c74;
  undefined1 uStack_c73;
  undefined1 uStack_c72;
  undefined1 uStack_c71;
  undefined1 uStack_c70;
  undefined1 uStack_c6f;
  undefined1 uStack_c6e;
  undefined1 uStack_c6d;
  undefined1 uStack_c6c;
  undefined1 uStack_c6b;
  undefined1 uStack_c6a;
  undefined1 uStack_c69;
  undefined1 local_c68;
  undefined1 uStack_c67;
  undefined1 uStack_c66;
  undefined1 uStack_c65;
  undefined1 uStack_c64;
  undefined1 uStack_c63;
  undefined1 uStack_c62;
  undefined1 uStack_c61;
  undefined1 uStack_c60;
  undefined1 uStack_c5f;
  undefined1 uStack_c5e;
  undefined1 uStack_c5d;
  undefined1 uStack_c5c;
  undefined1 uStack_c5b;
  undefined1 uStack_c5a;
  undefined1 uStack_c59;
  int local_c4c;
  char local_c48;
  char cStack_c47;
  char cStack_c46;
  char cStack_c45;
  char cStack_c44;
  char cStack_c43;
  char cStack_c42;
  char cStack_c41;
  char cStack_c40;
  char cStack_c3f;
  char cStack_c3e;
  char cStack_c3d;
  char cStack_c3c;
  char cStack_c3b;
  char cStack_c3a;
  char cStack_c39;
  longlong local_c28 [2];
  undefined8 local_c18;
  undefined8 uStack_c10;
  char local_c08;
  char cStack_c07;
  char cStack_c06;
  char cStack_c05;
  char cStack_c04;
  char cStack_c03;
  char cStack_c02;
  char cStack_c01;
  char cStack_c00;
  char cStack_bff;
  char cStack_bfe;
  char cStack_bfd;
  char cStack_bfc;
  char cStack_bfb;
  char cStack_bfa;
  char cStack_bf9;
  longlong local_be8 [2];
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  short local_bc8;
  short sStack_bc6;
  short sStack_bc4;
  short sStack_bc2;
  short sStack_bc0;
  short sStack_bbe;
  short sStack_bbc;
  short sStack_bba;
  undefined1 local_bb8 [16];
  int local_ba8;
  int iStack_ba4;
  int iStack_ba0;
  int iStack_b9c;
  __m128i *local_b88;
  __m128i *palStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined1 local_b18;
  undefined1 uStack_b17;
  undefined1 uStack_b16;
  undefined1 uStack_b15;
  undefined1 uStack_b14;
  undefined1 uStack_b13;
  undefined1 uStack_b12;
  undefined1 uStack_b11;
  undefined1 uStack_b10;
  undefined1 uStack_b0f;
  undefined1 uStack_b0e;
  undefined1 uStack_b0d;
  undefined1 uStack_b0c;
  undefined1 uStack_b0b;
  undefined1 uStack_b0a;
  undefined1 uStack_b09;
  undefined1 local_b08;
  undefined1 uStack_b07;
  undefined1 uStack_b06;
  undefined1 uStack_b05;
  undefined1 uStack_b04;
  undefined1 uStack_b03;
  undefined1 uStack_b02;
  undefined1 uStack_b01;
  undefined1 uStack_b00;
  undefined1 uStack_aff;
  undefined1 uStack_afe;
  undefined1 uStack_afd;
  undefined1 uStack_afc;
  undefined1 uStack_afb;
  undefined1 uStack_afa;
  undefined1 uStack_af9;
  ulong local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  longlong local_a98;
  longlong lStack_a90;
  int local_a7c;
  longlong local_a78;
  longlong lStack_a70;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  undefined2 local_a58;
  undefined2 uStack_a56;
  undefined2 uStack_a54;
  undefined2 uStack_a52;
  undefined2 uStack_a50;
  undefined2 uStack_a4e;
  undefined2 uStack_a4c;
  undefined2 uStack_a4a;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  ulong local_a28;
  undefined8 uStack_a20;
  uint local_a0c;
  void *local_a08;
  int local_a00;
  int local_9fc;
  undefined8 *local_9f8;
  undefined4 local_9f0;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  undefined4 *local_9e0;
  int local_9d4;
  undefined1 local_9c8 [16];
  uint local_9ac;
  undefined1 local_9a8 [16];
  uint local_998;
  int local_994;
  undefined2 local_990;
  undefined2 local_98e;
  undefined2 local_98c;
  undefined2 local_98a;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  __m128i *palStack_840;
  undefined1 local_838;
  undefined1 uStack_837;
  undefined1 uStack_836;
  undefined1 uStack_835;
  undefined1 uStack_834;
  undefined1 uStack_833;
  undefined1 uStack_832;
  undefined1 uStack_831;
  undefined1 local_828;
  undefined1 uStack_827;
  undefined1 uStack_826;
  undefined1 uStack_825;
  undefined1 uStack_824;
  undefined1 uStack_823;
  undefined1 uStack_822;
  undefined1 uStack_821;
  undefined1 local_818;
  undefined1 uStack_817;
  undefined1 uStack_816;
  undefined1 uStack_815;
  undefined1 uStack_814;
  undefined1 uStack_813;
  undefined1 uStack_812;
  undefined1 uStack_811;
  undefined8 local_808;
  __m128i *palStack_800;
  undefined1 uStack_7f7;
  undefined1 uStack_7f6;
  undefined1 uStack_7f5;
  undefined1 uStack_7f4;
  undefined1 uStack_7f3;
  undefined1 uStack_7f2;
  undefined1 uStack_7f1;
  undefined1 local_7e8;
  undefined1 uStack_7e7;
  undefined1 uStack_7e6;
  undefined1 uStack_7e5;
  undefined1 uStack_7e4;
  undefined1 uStack_7e3;
  undefined1 uStack_7e2;
  undefined1 uStack_7e1;
  undefined1 uStack_7d7;
  undefined1 uStack_7d6;
  undefined1 uStack_7d5;
  undefined1 uStack_7d4;
  undefined1 uStack_7d3;
  undefined1 uStack_7d2;
  undefined1 uStack_7d1;
  undefined1 local_7c8;
  undefined1 uStack_7c7;
  undefined1 uStack_7c6;
  undefined1 uStack_7c5;
  undefined1 uStack_7c4;
  undefined1 uStack_7c3;
  undefined1 uStack_7c2;
  undefined1 uStack_7c1;
  undefined1 uStack_7b7;
  undefined1 uStack_7b6;
  undefined1 uStack_7b5;
  undefined1 uStack_7b4;
  undefined1 uStack_7b3;
  undefined1 uStack_7b2;
  undefined1 uStack_7b1;
  undefined1 local_7a8;
  undefined1 uStack_7a7;
  undefined1 uStack_7a6;
  undefined1 uStack_7a5;
  undefined1 uStack_7a4;
  undefined1 uStack_7a3;
  undefined1 uStack_7a2;
  undefined1 uStack_7a1;
  undefined1 uStack_797;
  undefined1 uStack_796;
  undefined1 uStack_795;
  undefined1 uStack_794;
  undefined1 uStack_793;
  undefined1 uStack_792;
  undefined1 uStack_791;
  undefined1 local_788;
  undefined1 uStack_787;
  undefined1 uStack_786;
  undefined1 uStack_785;
  undefined1 uStack_784;
  undefined1 uStack_783;
  undefined1 uStack_782;
  undefined1 uStack_781;
  undefined1 uStack_777;
  undefined1 uStack_776;
  undefined1 uStack_775;
  undefined1 uStack_774;
  undefined1 uStack_773;
  undefined1 uStack_772;
  undefined1 uStack_771;
  undefined1 local_768;
  undefined1 uStack_767;
  undefined1 uStack_766;
  undefined1 uStack_765;
  undefined1 uStack_764;
  undefined1 uStack_763;
  undefined1 uStack_762;
  undefined1 uStack_761;
  undefined1 uStack_757;
  undefined1 uStack_756;
  undefined1 uStack_755;
  undefined1 uStack_754;
  undefined1 uStack_753;
  undefined1 uStack_752;
  undefined1 uStack_751;
  ulong local_748;
  undefined8 uStack_740;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  ulong local_728;
  undefined8 uStack_720;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  ulong local_708;
  undefined8 uStack_700;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  ulong local_6e8;
  undefined8 uStack_6e0;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  ulong local_6c8;
  undefined8 uStack_6c0;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  ulong local_6a8;
  undefined8 uStack_6a0;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  undefined8 uStack_5c0;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  ulong local_588;
  undefined8 uStack_580;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  longlong local_48;
  longlong lStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  longlong local_28;
  longlong lStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_9f0 = 8;
  local_9f8 = *(undefined8 **)(in_stack_00000018 + 2);
  local_9fc = in_stack_00000018[4];
  local_a00 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
  local_a08 = (void *)(in_RDI - local_a00 * in_ESI);
  local_a0c = 7 - in_stack_00000018[5];
  local_9a8._4_4_ = 0;
  local_9a8._0_4_ = local_a0c;
  local_a28 = local_9a8._0_8_;
  uStack_a20 = 0;
  local_a58 = (undefined2)in_stack_00000018[10];
  local_a38 = CONCAT26(local_a58,CONCAT24(local_a58,CONCAT22(local_a58,local_a58)));
  uStack_a30 = CONCAT26(local_a58,CONCAT24(local_a58,CONCAT22(local_a58,local_a58)));
  uStack_a56 = (undefined2)in_stack_00000018[0xb];
  local_a48 = CONCAT26(uStack_a56,CONCAT24(uStack_a56,CONCAT22(uStack_a56,uStack_a56)));
  uStack_a40 = CONCAT26(uStack_a56,CONCAT24(uStack_a56,CONCAT22(uStack_a56,uStack_a56)));
  local_a5c = *in_stack_00000018;
  local_a60 = in_stack_00000018[9];
  local_a64 = 0x16 - (in_stack_00000018[5] + in_stack_00000018[6]);
  local_a68 = (1 << ((byte)local_a64 & 0x1f)) + (1 << ((byte)local_a64 - 1 & 0x1f));
  local_98e = (undefined2)local_a68;
  local_2a = (undefined2)local_a68;
  local_2c = (undefined2)local_a68;
  local_2e = (undefined2)local_a68;
  local_30 = (undefined2)local_a68;
  local_32 = (undefined2)local_a68;
  local_34 = (undefined2)local_a68;
  local_36 = (undefined2)local_a68;
  local_38 = (undefined2)local_a68;
  local_a78 = CONCAT26((undefined2)local_a68,
                       CONCAT24((undefined2)local_a68,
                                CONCAT22((undefined2)local_a68,(undefined2)local_a68)));
  lStack_a70 = CONCAT26((undefined2)local_a68,
                        CONCAT24((undefined2)local_a68,
                                 CONCAT22((undefined2)local_a68,(undefined2)local_a68)));
  local_a7c = 0xe - (in_stack_00000018[5] + in_stack_00000018[6]);
  local_990 = (undefined2)((uint)(1 << ((byte)local_a7c & 0x1f)) >> 1);
  local_a98 = CONCAT26(local_990,CONCAT24(local_990,CONCAT22(local_990,local_990)));
  lStack_a90 = CONCAT26(local_990,CONCAT24(local_990,CONCAT22(local_990,local_990)));
  local_994 = (1 << (*(byte *)(in_stack_00000018 + 6) & 0x1f)) >> 1;
  local_aa8 = CONCAT44(local_994,local_994);
  uStack_aa0 = CONCAT44(local_994,local_994);
  local_9ac = in_stack_00000018[6];
  local_9c8._4_4_ = 0;
  local_9c8._0_4_ = local_9ac;
  local_ab8 = local_9c8._0_8_;
  uStack_ab0 = 0;
  uStack_a54 = local_a58;
  uStack_a52 = uStack_a56;
  uStack_a50 = local_a58;
  uStack_a4e = uStack_a56;
  uStack_a4c = local_a58;
  uStack_a4a = uStack_a56;
  local_9ec = in_R9D;
  local_9e8 = in_R8D;
  local_9e4 = in_ECX;
  local_9e0 = in_RDX;
  local_9d4 = in_ESI;
  local_9c8 = ZEXT416(local_9ac);
  local_9a8 = ZEXT416(local_a0c);
  local_998 = local_a0c;
  local_98c = uStack_a56;
  local_98a = local_a58;
  local_988 = local_a48;
  uStack_980 = uStack_a40;
  local_978 = local_a38;
  uStack_970 = uStack_a30;
  local_a8 = local_aa8;
  uStack_a0 = uStack_aa0;
  local_98 = local_994;
  local_94 = local_994;
  local_90 = local_994;
  local_8c = local_994;
  local_88 = local_a38;
  uStack_80 = uStack_a30;
  local_78 = local_a58;
  local_76 = local_a58;
  local_74 = local_a58;
  local_72 = local_a58;
  local_70 = local_a58;
  local_6e = local_a58;
  local_6c = local_a58;
  local_6a = local_a58;
  local_68 = local_a48;
  uStack_60 = uStack_a40;
  local_58 = uStack_a56;
  local_56 = uStack_a56;
  local_54 = uStack_a56;
  local_52 = uStack_a56;
  local_50 = uStack_a56;
  local_4e = uStack_a56;
  local_4c = uStack_a56;
  local_4a = uStack_a56;
  local_48 = local_a78;
  lStack_40 = lStack_a70;
  local_28 = local_a98;
  lStack_20 = lStack_a90;
  local_10 = local_990;
  local_e = local_990;
  local_c = local_990;
  local_a = local_990;
  local_8 = local_990;
  local_6 = local_990;
  local_4 = local_990;
  local_2 = local_990;
  prepare_coeffs(in_stack_fffffffffffff1d8,(int)((ulong)in_stack_fffffffffffff1d0 >> 0x20),
                 in_stack_fffffffffffff1c8);
  if (local_9e8 == 4) {
    xx_loadl_32(local_a08);
    data_ref_0_00 = extraout_XMM0_Qa;
    xx_loadl_32((void *)((long)local_a08 + (long)local_9d4));
    uStack_757 = (undefined1)((ulong)data_ref_0_00 >> 8);
    uStack_756 = (undefined1)((ulong)data_ref_0_00 >> 0x10);
    uStack_755 = (undefined1)((ulong)data_ref_0_00 >> 0x18);
    uStack_754 = (undefined1)((ulong)data_ref_0_00 >> 0x20);
    uStack_753 = (undefined1)((ulong)data_ref_0_00 >> 0x28);
    uStack_752 = (undefined1)((ulong)data_ref_0_00 >> 0x30);
    uStack_751 = (undefined1)((ulong)data_ref_0_00 >> 0x38);
    local_768 = (undefined1)extraout_XMM0_Qa_00;
    uStack_767 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
    uStack_766 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_765 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    uStack_764 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_763 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    uStack_762 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_761 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    local_b78 = CONCAT17(uStack_765,
                         CONCAT16(uStack_755,
                                  CONCAT15(uStack_766,
                                           CONCAT14(uStack_756,
                                                    CONCAT13(uStack_767,
                                                             CONCAT12(uStack_757,
                                                                      CONCAT11(local_768,
                                                                               (char)data_ref_0_00))
                                                            )))));
    uStack_b70 = CONCAT17(uStack_761,
                          CONCAT16(uStack_751,
                                   CONCAT15(uStack_762,
                                            CONCAT14(uStack_752,
                                                     CONCAT13(uStack_763,
                                                              CONCAT12(uStack_753,
                                                                       CONCAT11(uStack_764,
                                                                                uStack_754)))))));
    xx_loadl_32((void *)((long)local_a08 + (long)local_9d4));
    uVar32 = extraout_XMM0_Qa_01;
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 2)));
    uStack_777 = (undefined1)((ulong)uVar32 >> 8);
    uStack_776 = (undefined1)((ulong)uVar32 >> 0x10);
    uStack_775 = (undefined1)((ulong)uVar32 >> 0x18);
    uStack_774 = (undefined1)((ulong)uVar32 >> 0x20);
    uStack_773 = (undefined1)((ulong)uVar32 >> 0x28);
    uStack_772 = (undefined1)((ulong)uVar32 >> 0x30);
    uStack_771 = (undefined1)((ulong)uVar32 >> 0x38);
    local_788 = (undefined1)extraout_XMM0_Qa_02;
    uStack_787 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 8);
    uStack_786 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x10);
    uStack_785 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x18);
    uStack_784 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    uStack_783 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x28);
    uStack_782 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x30);
    uStack_781 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x38);
    local_b68 = CONCAT17(uStack_785,
                         CONCAT16(uStack_775,
                                  CONCAT15(uStack_786,
                                           CONCAT14(uStack_776,
                                                    CONCAT13(uStack_787,
                                                             CONCAT12(uStack_777,
                                                                      CONCAT11(local_788,
                                                                               (char)uVar32)))))));
    uStack_b60 = CONCAT17(uStack_781,
                          CONCAT16(uStack_771,
                                   CONCAT15(uStack_782,
                                            CONCAT14(uStack_772,
                                                     CONCAT13(uStack_783,
                                                              CONCAT12(uStack_773,
                                                                       CONCAT11(uStack_784,
                                                                                uStack_774)))))));
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 2)));
    coeffs_00 = extraout_XMM0_Qb;
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 3)));
    uStack_797 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 8);
    uStack_796 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x10);
    uStack_795 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x18);
    uStack_794 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x20);
    uStack_793 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x28);
    uStack_792 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x30);
    uStack_791 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x38);
    local_7a8 = (undefined1)extraout_XMM0_Qa_04;
    uStack_7a7 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 8);
    uStack_7a6 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x10);
    uStack_7a5 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x18);
    uStack_7a4 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x20);
    uStack_7a3 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x28);
    uStack_7a2 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x30);
    uStack_7a1 = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x38);
    local_b58 = CONCAT17(uStack_7a5,
                         CONCAT16(uStack_795,
                                  CONCAT15(uStack_7a6,
                                           CONCAT14(uStack_796,
                                                    CONCAT13(uStack_7a7,
                                                             CONCAT12(uStack_797,
                                                                      CONCAT11(local_7a8,
                                                                               (char)
                                                  extraout_XMM0_Qa_03)))))));
    uStack_b50 = CONCAT17(uStack_7a1,
                          CONCAT16(uStack_791,
                                   CONCAT15(uStack_7a2,
                                            CONCAT14(uStack_792,
                                                     CONCAT13(uStack_7a3,
                                                              CONCAT12(uStack_793,
                                                                       CONCAT11(uStack_7a4,
                                                                                uStack_794)))))));
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 3)));
    s_00 = extraout_XMM0_Qa_05;
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 << 2)));
    uStack_7b7 = (undefined1)((ulong)s_00 >> 8);
    uStack_7b6 = (undefined1)((ulong)s_00 >> 0x10);
    uStack_7b5 = (undefined1)((ulong)s_00 >> 0x18);
    uStack_7b4 = (undefined1)((ulong)s_00 >> 0x20);
    uStack_7b3 = (undefined1)((ulong)s_00 >> 0x28);
    uStack_7b2 = (undefined1)((ulong)s_00 >> 0x30);
    uStack_7b1 = (undefined1)((ulong)s_00 >> 0x38);
    local_7c8 = (undefined1)extraout_XMM0_Qa_06;
    uStack_7c7 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 8);
    uStack_7c6 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 0x10);
    uStack_7c5 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 0x18);
    uStack_7c4 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    uStack_7c3 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 0x28);
    uStack_7c2 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 0x30);
    uStack_7c1 = (undefined1)((ulong)extraout_XMM0_Qa_06 >> 0x38);
    local_b48 = CONCAT17(uStack_7c5,
                         CONCAT16(uStack_7b5,
                                  CONCAT15(uStack_7c6,
                                           CONCAT14(uStack_7b6,
                                                    CONCAT13(uStack_7c7,
                                                             CONCAT12(uStack_7b7,
                                                                      CONCAT11(local_7c8,(char)s_00)
                                                                     ))))));
    uStack_b40 = CONCAT17(uStack_7c1,
                          CONCAT16(uStack_7b1,
                                   CONCAT15(uStack_7c2,
                                            CONCAT14(uStack_7b2,
                                                     CONCAT13(uStack_7c3,
                                                              CONCAT12(uStack_7b3,
                                                                       CONCAT11(uStack_7c4,
                                                                                uStack_7b4)))))));
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 << 2)));
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 5)));
    uStack_7d7 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 8);
    uStack_7d6 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 0x10);
    uStack_7d5 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 0x18);
    uStack_7d4 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    uStack_7d3 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 0x28);
    uStack_7d2 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 0x30);
    uStack_7d1 = (undefined1)((ulong)extraout_XMM0_Qa_07 >> 0x38);
    local_7e8 = (undefined1)extraout_XMM0_Qa_08;
    uStack_7e7 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 8);
    uStack_7e6 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 0x10);
    uStack_7e5 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 0x18);
    uStack_7e4 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 0x20);
    uStack_7e3 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 0x28);
    uStack_7e2 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 0x30);
    uStack_7e1 = (undefined1)((ulong)extraout_XMM0_Qa_08 >> 0x38);
    local_b38 = CONCAT17(uStack_7e5,
                         CONCAT16(uStack_7d5,
                                  CONCAT15(uStack_7e6,
                                           CONCAT14(uStack_7d6,
                                                    CONCAT13(uStack_7e7,
                                                             CONCAT12(uStack_7d7,
                                                                      CONCAT11(local_7e8,
                                                                               (char)
                                                  extraout_XMM0_Qa_07)))))));
    uStack_b30 = CONCAT17(uStack_7e1,
                          CONCAT16(uStack_7d1,
                                   CONCAT15(uStack_7e2,
                                            CONCAT14(uStack_7d2,
                                                     CONCAT13(uStack_7e3,
                                                              CONCAT12(uStack_7d3,
                                                                       CONCAT11(uStack_7e4,
                                                                                uStack_7d4)))))));
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 6)));
    local_b88 = extraout_XMM0_Qa_09;
    palStack_b80 = extraout_XMM0_Qb_00;
    xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 5)));
    local_808 = local_b88;
    palVar22 = local_808;
    palStack_800 = palStack_b80;
    uStack_7f7 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 8);
    uStack_7f6 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 0x10);
    uStack_7f5 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 0x18);
    uStack_7f4 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 0x20);
    uStack_7f3 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 0x28);
    uStack_7f2 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 0x30);
    uStack_7f1 = (undefined1)((ulong)extraout_XMM0_Qa_10 >> 0x38);
    local_808._0_1_ = SUB81(local_b88,0);
    local_808._1_1_ = (undefined1)((ulong)local_b88 >> 8);
    local_808._2_1_ = (undefined1)((ulong)local_b88 >> 0x10);
    local_808._3_1_ = (undefined1)((ulong)local_b88 >> 0x18);
    local_808._4_1_ = (undefined1)((ulong)local_b88 >> 0x20);
    local_808._5_1_ = (undefined1)((ulong)local_b88 >> 0x28);
    local_808._6_1_ = (undefined1)((ulong)local_b88 >> 0x30);
    local_808._7_1_ = (undefined1)((ulong)local_b88 >> 0x38);
    local_b28 = CONCAT17(local_808._3_1_,
                         CONCAT16(uStack_7f5,
                                  CONCAT15(local_808._2_1_,
                                           CONCAT14(uStack_7f6,
                                                    CONCAT13(local_808._1_1_,
                                                             CONCAT12(uStack_7f7,
                                                                      CONCAT11((undefined1)local_808
                                                                               ,(char)
                                                  extraout_XMM0_Qa_10)))))));
    uStack_b20 = CONCAT17(local_808._7_1_,
                          CONCAT16(uStack_7f1,
                                   CONCAT15(local_808._6_1_,
                                            CONCAT14(uStack_7f2,
                                                     CONCAT13(local_808._5_1_,
                                                              CONCAT12(uStack_7f3,
                                                                       CONCAT11(local_808._4_1_,
                                                                                uStack_7f4)))))));
    local_808 = palVar22;
    do {
      xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 7)));
      local_818 = SUB81(local_b88,0);
      uStack_817 = (undefined1)((ulong)local_b88 >> 8);
      uStack_816 = (undefined1)((ulong)local_b88 >> 0x10);
      uStack_815 = (undefined1)((ulong)local_b88 >> 0x18);
      uStack_814 = (undefined1)((ulong)local_b88 >> 0x20);
      uStack_813 = (undefined1)((ulong)local_b88 >> 0x28);
      uStack_812 = (undefined1)((ulong)local_b88 >> 0x30);
      uStack_811 = (undefined1)((ulong)local_b88 >> 0x38);
      local_828 = (undefined1)extraout_XMM0_Qa_11;
      uStack_827 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 8);
      uStack_826 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 0x10);
      uStack_825 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 0x18);
      uStack_824 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 0x20);
      uStack_823 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 0x28);
      uStack_822 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 0x30);
      uStack_821 = (undefined1)((ulong)extraout_XMM0_Qa_11 >> 0x38);
      local_b18 = local_818;
      uStack_b17 = local_828;
      uStack_b16 = uStack_817;
      uStack_b15 = uStack_827;
      uStack_b14 = uStack_816;
      uStack_b13 = uStack_826;
      uStack_b12 = uStack_815;
      uStack_b11 = uStack_825;
      uStack_b10 = uStack_814;
      uStack_b0f = uStack_824;
      uStack_b0e = uStack_813;
      uStack_b0d = uStack_823;
      uStack_b0c = uStack_812;
      uStack_b0b = uStack_822;
      uStack_b0a = uStack_811;
      uStack_b09 = uStack_821;
      xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 << 3)));
      wt_00 = local_b88;
      res_unsigned_00 = palStack_b80;
      local_b88 = extraout_XMM0_Qa_12;
      palStack_b80 = extraout_XMM0_Qb_01;
      xx_loadl_32((void *)((long)local_a08 + (long)(local_9d4 * 7)));
      local_848 = local_b88;
      palVar22 = local_848;
      palStack_840 = palStack_b80;
      local_838 = (undefined1)extraout_XMM0_Qa_13;
      uStack_837 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 8);
      uStack_836 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 0x10);
      uStack_835 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 0x18);
      uStack_834 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 0x20);
      uStack_833 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 0x28);
      uStack_832 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 0x30);
      uStack_831 = (undefined1)((ulong)extraout_XMM0_Qa_13 >> 0x38);
      local_848._0_1_ = SUB81(local_b88,0);
      local_848._1_1_ = (undefined1)((ulong)local_b88 >> 8);
      local_848._2_1_ = (undefined1)((ulong)local_b88 >> 0x10);
      local_848._3_1_ = (undefined1)((ulong)local_b88 >> 0x18);
      local_848._4_1_ = (undefined1)((ulong)local_b88 >> 0x20);
      local_848._5_1_ = (undefined1)((ulong)local_b88 >> 0x28);
      local_848._6_1_ = (undefined1)((ulong)local_b88 >> 0x30);
      local_848._7_1_ = (undefined1)((ulong)local_b88 >> 0x38);
      local_b08 = local_838;
      uStack_b07 = (undefined1)local_848;
      uStack_b06 = uStack_837;
      uStack_b05 = local_848._1_1_;
      uStack_b04 = uStack_836;
      uStack_b03 = local_848._2_1_;
      uStack_b02 = uStack_835;
      uStack_b01 = local_848._3_1_;
      uStack_b00 = uStack_834;
      uStack_aff = local_848._4_1_;
      uStack_afe = uStack_833;
      uStack_afd = local_848._5_1_;
      uStack_afc = uStack_832;
      uStack_afb = local_848._6_1_;
      uStack_afa = uStack_831;
      uStack_af9 = local_848._7_1_;
      local_848 = palVar22;
      convolve_lo_y(s_00,coeffs_00);
      local_528 = local_a28;
      uVar24 = local_528;
      uStack_520 = uStack_a20;
      uVar25 = uStack_520;
      local_518 = (int)extraout_XMM0_Qa_14;
      iStack_514 = (int)((ulong)extraout_XMM0_Qa_14 >> 0x20);
      iStack_510 = (int)extraout_XMM0_Qb_02;
      iStack_50c = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      local_528._0_4_ = (int)local_a28;
      local_528._4_4_ = (int)(local_a28 >> 0x20);
      uStack_520._0_4_ = (int)uStack_a20;
      uStack_520._4_4_ = (int)((ulong)uStack_a20 >> 0x20);
      local_5d8 = CONCAT44(iStack_514 << local_528._4_4_,local_518 << (int)local_528);
      uStack_5d0 = CONCAT44(iStack_50c << uStack_520._4_4_,iStack_510 << (int)uStack_520);
      local_5e8 = local_aa8;
      uVar32 = local_5e8;
      uStack_5e0 = uStack_aa0;
      uVar23 = uStack_5e0;
      local_5e8._0_4_ = (int)local_aa8;
      local_5e8._4_4_ = (int)((ulong)local_aa8 >> 0x20);
      uStack_5e0._0_4_ = (int)uStack_aa0;
      uStack_5e0._4_4_ = (int)((ulong)uStack_aa0 >> 0x20);
      local_698 = (local_518 << (int)local_528) + (int)local_5e8;
      iStack_694 = (iStack_514 << local_528._4_4_) + local_5e8._4_4_;
      iStack_690 = (iStack_510 << (int)uStack_520) + (int)uStack_5e0;
      iStack_68c = (iStack_50c << uStack_520._4_4_) + uStack_5e0._4_4_;
      local_6a8 = local_ab8;
      uStack_6a0 = uStack_ab0;
      auVar13._8_8_ = uStack_ab0;
      auVar13._0_8_ = local_ab8;
      local_ba8 = local_698 >> auVar13;
      iStack_ba4 = iStack_694 >> auVar13;
      iStack_ba0 = iStack_690 >> auVar13;
      iStack_b9c = iStack_68c >> auVar13;
      local_498 = CONCAT44(iStack_ba4,local_ba8);
      uStack_490 = CONCAT44(iStack_b9c,iStack_ba0);
      local_4a8 = CONCAT44(iStack_ba4,local_ba8);
      uStack_4a0 = CONCAT44(iStack_b9c,iStack_ba0);
      auVar21._8_8_ = uStack_490;
      auVar21._0_8_ = local_498;
      auVar20._8_8_ = uStack_4a0;
      auVar20._0_8_ = local_4a8;
      local_bb8 = packssdw(auVar21,auVar20);
      local_418 = local_bb8._0_8_;
      uVar26 = local_418;
      uStack_410 = local_bb8._8_8_;
      uVar27 = uStack_410;
      local_428 = local_a78;
      lVar28 = local_428;
      uStack_420 = lStack_a70;
      lVar29 = uStack_420;
      local_418._0_2_ = local_bb8._0_2_;
      local_418._2_2_ = local_bb8._2_2_;
      local_418._4_2_ = local_bb8._4_2_;
      local_418._6_2_ = local_bb8._6_2_;
      uStack_410._0_2_ = local_bb8._8_2_;
      uStack_410._2_2_ = local_bb8._10_2_;
      uStack_410._4_2_ = local_bb8._12_2_;
      uStack_410._6_2_ = local_bb8._14_2_;
      local_428._0_2_ = (short)local_a78;
      local_428._2_2_ = (short)((ulong)local_a78 >> 0x10);
      local_428._4_2_ = (short)((ulong)local_a78 >> 0x20);
      local_428._6_2_ = (short)((ulong)local_a78 >> 0x30);
      uStack_420._0_2_ = (short)lStack_a70;
      uStack_420._2_2_ = (short)((ulong)lStack_a70 >> 0x10);
      uStack_420._4_2_ = (short)((ulong)lStack_a70 >> 0x20);
      uStack_420._6_2_ = (short)((ulong)lStack_a70 >> 0x30);
      local_bc8 = (short)local_418 + (short)local_428;
      sStack_bc6 = local_418._2_2_ + local_428._2_2_;
      sStack_bc4 = local_418._4_2_ + local_428._4_2_;
      sStack_bc2 = local_418._6_2_ + local_428._6_2_;
      sStack_bc0 = (short)uStack_410 + (short)uStack_420;
      sStack_bbe = uStack_410._2_2_ + uStack_420._2_2_;
      sStack_bbc = uStack_410._4_2_ + uStack_420._4_2_;
      sStack_bba = uStack_410._6_2_ + uStack_420._6_2_;
      local_5e8 = uVar32;
      uStack_5e0 = uVar23;
      local_528 = uVar24;
      uStack_520 = uVar25;
      local_428 = lVar28;
      uStack_420 = lVar29;
      local_418 = uVar26;
      uStack_410 = uVar27;
      if (local_a5c == 0) {
        local_2e8 = CONCAT26(sStack_bc2,CONCAT24(sStack_bc4,CONCAT22(sStack_bc6,local_bc8)));
        uStack_2e0 = CONCAT26(sStack_bba,CONCAT24(sStack_bbc,CONCAT22(sStack_bbe,sStack_bc0)));
        local_2d0 = local_9f8;
        *local_9f8 = local_2e8;
        local_9f8[1] = uStack_2e0;
      }
      else {
        local_950 = local_9f8;
        local_bd8 = *local_9f8;
        uStack_bd0 = local_9f8[1];
        comp_avg(data_ref_0_00,res_unsigned_00,wt_00,0);
        convolve_rounding(&local_be8,(__m128i *)&local_a78,(__m128i *)&local_a98,local_a7c);
        local_398 = (short)extraout_XMM0_Qa_15;
        sStack_396 = (short)((ulong)extraout_XMM0_Qa_15 >> 0x10);
        sStack_394 = (short)((ulong)extraout_XMM0_Qa_15 >> 0x20);
        sStack_392 = (short)((ulong)extraout_XMM0_Qa_15 >> 0x30);
        sStack_390 = (short)extraout_XMM0_Qb_03;
        sStack_38e = (short)((ulong)extraout_XMM0_Qb_03 >> 0x10);
        sStack_38c = (short)((ulong)extraout_XMM0_Qb_03 >> 0x20);
        sStack_38a = (short)((ulong)extraout_XMM0_Qb_03 >> 0x30);
        local_c08 = (0 < local_398) * (local_398 < 0x100) * (char)extraout_XMM0_Qa_15 -
                    (0xff < local_398);
        cVar1 = (char)((ulong)extraout_XMM0_Qa_15 >> 0x10);
        cStack_c07 = (0 < sStack_396) * (sStack_396 < 0x100) * cVar1 - (0xff < sStack_396);
        cVar2 = (char)((ulong)extraout_XMM0_Qa_15 >> 0x20);
        cStack_c06 = (0 < sStack_394) * (sStack_394 < 0x100) * cVar2 - (0xff < sStack_394);
        cVar3 = (char)((ulong)extraout_XMM0_Qa_15 >> 0x30);
        cStack_c05 = (0 < sStack_392) * (sStack_392 < 0x100) * cVar3 - (0xff < sStack_392);
        cStack_c04 = (0 < sStack_390) * (sStack_390 < 0x100) * (char)extraout_XMM0_Qb_03 -
                     (0xff < sStack_390);
        cVar4 = (char)((ulong)extraout_XMM0_Qb_03 >> 0x10);
        cStack_c03 = (0 < sStack_38e) * (sStack_38e < 0x100) * cVar4 - (0xff < sStack_38e);
        cVar5 = (char)((ulong)extraout_XMM0_Qb_03 >> 0x20);
        cStack_c02 = (0 < sStack_38c) * (sStack_38c < 0x100) * cVar5 - (0xff < sStack_38c);
        cVar6 = (char)((ulong)extraout_XMM0_Qb_03 >> 0x30);
        cStack_c01 = (0 < sStack_38a) * (sStack_38a < 0x100) * cVar6 - (0xff < sStack_38a);
        cStack_c00 = (0 < local_398) * (local_398 < 0x100) * (char)extraout_XMM0_Qa_15 -
                     (0xff < local_398);
        cStack_bff = (0 < sStack_396) * (sStack_396 < 0x100) * cVar1 - (0xff < sStack_396);
        cStack_bfe = (0 < sStack_394) * (sStack_394 < 0x100) * cVar2 - (0xff < sStack_394);
        cStack_bfd = (0 < sStack_392) * (sStack_392 < 0x100) * cVar3 - (0xff < sStack_392);
        cStack_bfc = (0 < sStack_390) * (sStack_390 < 0x100) * (char)extraout_XMM0_Qb_03 -
                     (0xff < sStack_390);
        cStack_bfb = (0 < sStack_38e) * (sStack_38e < 0x100) * cVar4 - (0xff < sStack_38e);
        cStack_bfa = (0 < sStack_38c) * (sStack_38c < 0x100) * cVar5 - (0xff < sStack_38c);
        cStack_bf9 = (0 < sStack_38a) * (sStack_38a < 0x100) * cVar6 - (0xff < sStack_38a);
        uVar7 = CONCAT13(cStack_c05,CONCAT12(cStack_c06,CONCAT11(cStack_c07,local_c08)));
        local_368 = CONCAT17(cStack_c01,
                             CONCAT16(cStack_c02,CONCAT15(cStack_c03,CONCAT14(cStack_c04,uVar7))));
        uStack_360 = CONCAT17(cStack_bf9,
                              CONCAT16(cStack_bfa,
                                       CONCAT15(cStack_bfb,
                                                CONCAT14(cStack_bfc,
                                                         CONCAT13(cStack_bfd,
                                                                  CONCAT12(cStack_bfe,
                                                                           CONCAT11(cStack_bff,
                                                                                    cStack_c00))))))
                             );
        *local_9e0 = uVar7;
        local_358 = local_368;
        uStack_350 = uStack_360;
      }
      local_a08 = (void *)((long)local_a08 + (long)local_9d4);
      local_9f8 = (undefined8 *)((long)local_9f8 + (long)local_9fc * 2);
      local_9e0 = (undefined4 *)((long)local_9e0 + (long)local_9e4);
      convolve_lo_y(s_00,coeffs_00);
      local_548 = local_a28;
      uVar24 = local_548;
      uStack_540 = uStack_a20;
      uVar25 = uStack_540;
      local_538 = (int)extraout_XMM0_Qa_16;
      iStack_534 = (int)((ulong)extraout_XMM0_Qa_16 >> 0x20);
      iStack_530 = (int)extraout_XMM0_Qb_04;
      iStack_52c = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
      local_548._0_4_ = (int)local_a28;
      local_548._4_4_ = (int)(local_a28 >> 0x20);
      uStack_540._0_4_ = (int)uStack_a20;
      uStack_540._4_4_ = (int)((ulong)uStack_a20 >> 0x20);
      local_5f8 = CONCAT44(iStack_534 << local_548._4_4_,local_538 << (int)local_548);
      uStack_5f0 = CONCAT44(iStack_52c << uStack_540._4_4_,iStack_530 << (int)uStack_540);
      local_608 = local_aa8;
      uVar32 = local_608;
      uStack_600 = uStack_aa0;
      uVar23 = uStack_600;
      local_608._0_4_ = (int)local_aa8;
      local_608._4_4_ = (int)((ulong)local_aa8 >> 0x20);
      uStack_600._0_4_ = (int)uStack_aa0;
      uStack_600._4_4_ = (int)((ulong)uStack_aa0 >> 0x20);
      local_6b8 = (local_538 << (int)local_548) + (int)local_608;
      iStack_6b4 = (iStack_534 << local_548._4_4_) + local_608._4_4_;
      iStack_6b0 = (iStack_530 << (int)uStack_540) + (int)uStack_600;
      iStack_6ac = (iStack_52c << uStack_540._4_4_) + uStack_600._4_4_;
      local_6c8 = local_ab8;
      uStack_6c0 = uStack_ab0;
      auVar12._8_8_ = uStack_ab0;
      auVar12._0_8_ = local_ab8;
      local_ba8 = local_6b8 >> auVar12;
      iStack_ba4 = iStack_6b4 >> auVar12;
      iStack_ba0 = iStack_6b0 >> auVar12;
      iStack_b9c = iStack_6ac >> auVar12;
      local_4b8 = CONCAT44(iStack_ba4,local_ba8);
      uStack_4b0 = CONCAT44(iStack_b9c,iStack_ba0);
      local_4c8 = CONCAT44(iStack_ba4,local_ba8);
      uStack_4c0 = CONCAT44(iStack_b9c,iStack_ba0);
      auVar19._8_8_ = uStack_4b0;
      auVar19._0_8_ = local_4b8;
      auVar18._8_8_ = uStack_4c0;
      auVar18._0_8_ = local_4c8;
      local_bb8 = packssdw(auVar19,auVar18);
      local_438 = local_bb8._0_8_;
      uVar26 = local_438;
      uStack_430 = local_bb8._8_8_;
      uVar27 = uStack_430;
      local_448 = local_a78;
      lVar28 = local_448;
      uStack_440 = lStack_a70;
      lVar29 = uStack_440;
      local_438._0_2_ = local_bb8._0_2_;
      local_438._2_2_ = local_bb8._2_2_;
      local_438._4_2_ = local_bb8._4_2_;
      local_438._6_2_ = local_bb8._6_2_;
      uStack_430._0_2_ = local_bb8._8_2_;
      uStack_430._2_2_ = local_bb8._10_2_;
      uStack_430._4_2_ = local_bb8._12_2_;
      uStack_430._6_2_ = local_bb8._14_2_;
      local_448._0_2_ = (short)local_a78;
      local_448._2_2_ = (short)((ulong)local_a78 >> 0x10);
      local_448._4_2_ = (short)((ulong)local_a78 >> 0x20);
      local_448._6_2_ = (short)((ulong)local_a78 >> 0x30);
      uStack_440._0_2_ = (short)lStack_a70;
      uStack_440._2_2_ = (short)((ulong)lStack_a70 >> 0x10);
      uStack_440._4_2_ = (short)((ulong)lStack_a70 >> 0x20);
      uStack_440._6_2_ = (short)((ulong)lStack_a70 >> 0x30);
      local_bc8 = (short)local_438 + (short)local_448;
      sStack_bc6 = local_438._2_2_ + local_448._2_2_;
      sStack_bc4 = local_438._4_2_ + local_448._4_2_;
      sStack_bc2 = local_438._6_2_ + local_448._6_2_;
      sStack_bc0 = (short)uStack_430 + (short)uStack_440;
      sStack_bbe = uStack_430._2_2_ + uStack_440._2_2_;
      sStack_bbc = uStack_430._4_2_ + uStack_440._4_2_;
      sStack_bba = uStack_430._6_2_ + uStack_440._6_2_;
      local_608 = uVar32;
      uStack_600 = uVar23;
      local_548 = uVar24;
      uStack_540 = uVar25;
      local_448 = lVar28;
      uStack_440 = lVar29;
      local_438 = uVar26;
      uStack_430 = uVar27;
      if (local_a5c == 0) {
        local_308 = CONCAT26(sStack_bc2,CONCAT24(sStack_bc4,CONCAT22(sStack_bc6,local_bc8)));
        uStack_300 = CONCAT26(sStack_bba,CONCAT24(sStack_bbc,CONCAT22(sStack_bbe,sStack_bc0)));
        local_2f0 = local_9f8;
        *local_9f8 = local_308;
        local_9f8[1] = uStack_300;
      }
      else {
        local_958 = local_9f8;
        local_c18 = *local_9f8;
        uStack_c10 = local_9f8[1];
        comp_avg(data_ref_0_00,res_unsigned_00,wt_00,0);
        convolve_rounding(&local_c28,(__m128i *)&local_a78,(__m128i *)&local_a98,local_a7c);
        local_3b8 = (short)extraout_XMM0_Qa_17;
        sStack_3b6 = (short)((ulong)extraout_XMM0_Qa_17 >> 0x10);
        sStack_3b4 = (short)((ulong)extraout_XMM0_Qa_17 >> 0x20);
        sStack_3b2 = (short)((ulong)extraout_XMM0_Qa_17 >> 0x30);
        sStack_3b0 = (short)extraout_XMM0_Qb_05;
        sStack_3ae = (short)((ulong)extraout_XMM0_Qb_05 >> 0x10);
        sStack_3ac = (short)((ulong)extraout_XMM0_Qb_05 >> 0x20);
        sStack_3aa = (short)((ulong)extraout_XMM0_Qb_05 >> 0x30);
        local_c48 = (0 < local_3b8) * (local_3b8 < 0x100) * (char)extraout_XMM0_Qa_17 -
                    (0xff < local_3b8);
        cVar1 = (char)((ulong)extraout_XMM0_Qa_17 >> 0x10);
        cStack_c47 = (0 < sStack_3b6) * (sStack_3b6 < 0x100) * cVar1 - (0xff < sStack_3b6);
        cVar2 = (char)((ulong)extraout_XMM0_Qa_17 >> 0x20);
        cStack_c46 = (0 < sStack_3b4) * (sStack_3b4 < 0x100) * cVar2 - (0xff < sStack_3b4);
        cVar3 = (char)((ulong)extraout_XMM0_Qa_17 >> 0x30);
        cStack_c45 = (0 < sStack_3b2) * (sStack_3b2 < 0x100) * cVar3 - (0xff < sStack_3b2);
        cStack_c44 = (0 < sStack_3b0) * (sStack_3b0 < 0x100) * (char)extraout_XMM0_Qb_05 -
                     (0xff < sStack_3b0);
        cVar4 = (char)((ulong)extraout_XMM0_Qb_05 >> 0x10);
        cStack_c43 = (0 < sStack_3ae) * (sStack_3ae < 0x100) * cVar4 - (0xff < sStack_3ae);
        cVar5 = (char)((ulong)extraout_XMM0_Qb_05 >> 0x20);
        cStack_c42 = (0 < sStack_3ac) * (sStack_3ac < 0x100) * cVar5 - (0xff < sStack_3ac);
        cVar6 = (char)((ulong)extraout_XMM0_Qb_05 >> 0x30);
        cStack_c41 = (0 < sStack_3aa) * (sStack_3aa < 0x100) * cVar6 - (0xff < sStack_3aa);
        cStack_c40 = (0 < local_3b8) * (local_3b8 < 0x100) * (char)extraout_XMM0_Qa_17 -
                     (0xff < local_3b8);
        cStack_c3f = (0 < sStack_3b6) * (sStack_3b6 < 0x100) * cVar1 - (0xff < sStack_3b6);
        cStack_c3e = (0 < sStack_3b4) * (sStack_3b4 < 0x100) * cVar2 - (0xff < sStack_3b4);
        cStack_c3d = (0 < sStack_3b2) * (sStack_3b2 < 0x100) * cVar3 - (0xff < sStack_3b2);
        cStack_c3c = (0 < sStack_3b0) * (sStack_3b0 < 0x100) * (char)extraout_XMM0_Qb_05 -
                     (0xff < sStack_3b0);
        cStack_c3b = (0 < sStack_3ae) * (sStack_3ae < 0x100) * cVar4 - (0xff < sStack_3ae);
        cStack_c3a = (0 < sStack_3ac) * (sStack_3ac < 0x100) * cVar5 - (0xff < sStack_3ac);
        cStack_c39 = (0 < sStack_3aa) * (sStack_3aa < 0x100) * cVar6 - (0xff < sStack_3aa);
        uVar7 = CONCAT13(cStack_c45,CONCAT12(cStack_c46,CONCAT11(cStack_c47,local_c48)));
        local_388 = CONCAT17(cStack_c41,
                             CONCAT16(cStack_c42,CONCAT15(cStack_c43,CONCAT14(cStack_c44,uVar7))));
        uStack_380 = CONCAT17(cStack_c39,
                              CONCAT16(cStack_c3a,
                                       CONCAT15(cStack_c3b,
                                                CONCAT14(cStack_c3c,
                                                         CONCAT13(cStack_c3d,
                                                                  CONCAT12(cStack_c3e,
                                                                           CONCAT11(cStack_c3f,
                                                                                    cStack_c40))))))
                             );
        *local_9e0 = uVar7;
        local_378 = local_388;
        uStack_370 = uStack_380;
      }
      local_a08 = (void *)((long)local_a08 + (long)local_9d4);
      local_9f8 = (undefined8 *)((long)local_9f8 + (long)local_9fc * 2);
      local_9e0 = (undefined4 *)((long)local_9e0 + (long)local_9e4);
      local_b78 = local_b58;
      uStack_b70 = uStack_b50;
      local_b68 = local_b48;
      uStack_b60 = uStack_b40;
      local_b58 = local_b38;
      uStack_b50 = uStack_b30;
      local_b48 = local_b28;
      uStack_b40 = uStack_b20;
      local_b38 = CONCAT17(uStack_b11,
                           CONCAT16(uStack_b12,
                                    CONCAT15(uStack_b13,
                                             CONCAT14(uStack_b14,
                                                      CONCAT13(uStack_b15,
                                                               CONCAT12(uStack_b16,
                                                                        CONCAT11(uStack_b17,
                                                                                 local_b18)))))));
      uStack_b30 = CONCAT17(uStack_b09,
                            CONCAT16(uStack_b0a,
                                     CONCAT15(uStack_b0b,
                                              CONCAT14(uStack_b0c,
                                                       CONCAT13(uStack_b0d,
                                                                CONCAT12(uStack_b0e,
                                                                         CONCAT11(uStack_b0f,
                                                                                  uStack_b10)))))));
      local_b28 = CONCAT17(uStack_b01,
                           CONCAT16(uStack_b02,
                                    CONCAT15(uStack_b03,
                                             CONCAT14(uStack_b04,
                                                      CONCAT13(uStack_b05,
                                                               CONCAT12(uStack_b06,
                                                                        CONCAT11(uStack_b07,
                                                                                 local_b08)))))));
      uStack_b20 = CONCAT17(uStack_af9,
                            CONCAT16(uStack_afa,
                                     CONCAT15(uStack_afb,
                                              CONCAT14(uStack_afc,
                                                       CONCAT13(uStack_afd,
                                                                CONCAT12(uStack_afe,
                                                                         CONCAT11(uStack_aff,
                                                                                  uStack_b00)))))));
      local_9ec = local_9ec + -2;
    } while (local_9ec != 0);
  }
  else {
    local_c4c = 0;
    do {
      local_d0 = (undefined8 *)((long)local_a08 + (long)local_c4c);
      local_b0 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 6));
      local_ce8 = *local_b0;
      uStack_c0 = 0;
      uStack_ce0 = 0;
      local_e8 = *local_d0;
      uStack_e0 = 0;
      local_f0 = (undefined8 *)((long)local_d0 + (long)local_9d4);
      local_108 = *local_f0;
      uStack_100 = 0;
      uStack_850 = 0;
      uStack_860 = 0;
      local_858._1_1_ = (undefined1)((ulong)local_e8 >> 8);
      local_858._2_1_ = (undefined1)((ulong)local_e8 >> 0x10);
      local_858._3_1_ = (undefined1)((ulong)local_e8 >> 0x18);
      local_858._4_1_ = (undefined1)((ulong)local_e8 >> 0x20);
      local_858._5_1_ = (undefined1)((ulong)local_e8 >> 0x28);
      local_858._6_1_ = (undefined1)((ulong)local_e8 >> 0x30);
      local_858._7_1_ = (undefined1)((ulong)local_e8 >> 0x38);
      local_868._0_1_ = (undefined1)local_108;
      local_868._1_1_ = (undefined1)((ulong)local_108 >> 8);
      local_868._2_1_ = (undefined1)((ulong)local_108 >> 0x10);
      local_868._3_1_ = (undefined1)((ulong)local_108 >> 0x18);
      local_868._4_1_ = (undefined1)((ulong)local_108 >> 0x20);
      local_868._5_1_ = (undefined1)((ulong)local_108 >> 0x28);
      local_868._6_1_ = (undefined1)((ulong)local_108 >> 0x30);
      local_868._7_1_ = (undefined1)((ulong)local_108 >> 0x38);
      local_cd8 = CONCAT17(local_868._3_1_,
                           CONCAT16(local_858._3_1_,
                                    CONCAT15(local_868._2_1_,
                                             CONCAT14(local_858._2_1_,
                                                      CONCAT13(local_868._1_1_,
                                                               CONCAT12(local_858._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_868,
                                                                                 (char)local_e8)))))
                                   ));
      uStack_cd0 = CONCAT17(local_868._7_1_,
                            CONCAT16(local_858._7_1_,
                                     CONCAT15(local_868._6_1_,
                                              CONCAT14(local_858._6_1_,
                                                       CONCAT13(local_868._5_1_,
                                                                CONCAT12(local_858._5_1_,
                                                                         CONCAT11(local_868._4_1_,
                                                                                  local_858._4_1_)))
                                                      ))));
      local_110 = (undefined8 *)((long)local_d0 + (long)local_9d4);
      local_128 = *local_110;
      uStack_120 = 0;
      local_130 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 2));
      local_148 = *local_130;
      uStack_140 = 0;
      uStack_870 = 0;
      uStack_880 = 0;
      local_878._1_1_ = (undefined1)((ulong)local_128 >> 8);
      local_878._2_1_ = (undefined1)((ulong)local_128 >> 0x10);
      local_878._3_1_ = (undefined1)((ulong)local_128 >> 0x18);
      local_878._4_1_ = (undefined1)((ulong)local_128 >> 0x20);
      local_878._5_1_ = (undefined1)((ulong)local_128 >> 0x28);
      local_878._6_1_ = (undefined1)((ulong)local_128 >> 0x30);
      local_878._7_1_ = (undefined1)((ulong)local_128 >> 0x38);
      local_888._0_1_ = (undefined1)local_148;
      local_888._1_1_ = (undefined1)((ulong)local_148 >> 8);
      local_888._2_1_ = (undefined1)((ulong)local_148 >> 0x10);
      local_888._3_1_ = (undefined1)((ulong)local_148 >> 0x18);
      local_888._4_1_ = (undefined1)((ulong)local_148 >> 0x20);
      local_888._5_1_ = (undefined1)((ulong)local_148 >> 0x28);
      local_888._6_1_ = (undefined1)((ulong)local_148 >> 0x30);
      local_888._7_1_ = (undefined1)((ulong)local_148 >> 0x38);
      local_cc8 = CONCAT17(local_888._3_1_,
                           CONCAT16(local_878._3_1_,
                                    CONCAT15(local_888._2_1_,
                                             CONCAT14(local_878._2_1_,
                                                      CONCAT13(local_888._1_1_,
                                                               CONCAT12(local_878._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_888,
                                                                                 (char)local_128))))
                                            )));
      uStack_cc0 = CONCAT17(local_888._7_1_,
                            CONCAT16(local_878._7_1_,
                                     CONCAT15(local_888._6_1_,
                                              CONCAT14(local_878._6_1_,
                                                       CONCAT13(local_888._5_1_,
                                                                CONCAT12(local_878._5_1_,
                                                                         CONCAT11(local_888._4_1_,
                                                                                  local_878._4_1_)))
                                                      ))));
      local_150 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 2));
      local_168 = *local_150;
      uStack_160 = 0;
      local_170 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 3));
      local_188 = *local_170;
      uStack_180 = 0;
      uStack_890 = 0;
      uStack_8a0 = 0;
      local_898._1_1_ = (undefined1)((ulong)local_168 >> 8);
      local_898._2_1_ = (undefined1)((ulong)local_168 >> 0x10);
      local_898._3_1_ = (undefined1)((ulong)local_168 >> 0x18);
      local_898._4_1_ = (undefined1)((ulong)local_168 >> 0x20);
      local_898._5_1_ = (undefined1)((ulong)local_168 >> 0x28);
      local_898._6_1_ = (undefined1)((ulong)local_168 >> 0x30);
      local_898._7_1_ = (undefined1)((ulong)local_168 >> 0x38);
      local_8a8._0_1_ = (undefined1)local_188;
      local_8a8._1_1_ = (undefined1)((ulong)local_188 >> 8);
      local_8a8._2_1_ = (undefined1)((ulong)local_188 >> 0x10);
      local_8a8._3_1_ = (undefined1)((ulong)local_188 >> 0x18);
      local_8a8._4_1_ = (undefined1)((ulong)local_188 >> 0x20);
      local_8a8._5_1_ = (undefined1)((ulong)local_188 >> 0x28);
      local_8a8._6_1_ = (undefined1)((ulong)local_188 >> 0x30);
      local_8a8._7_1_ = (undefined1)((ulong)local_188 >> 0x38);
      local_cb8 = CONCAT17(local_8a8._3_1_,
                           CONCAT16(local_898._3_1_,
                                    CONCAT15(local_8a8._2_1_,
                                             CONCAT14(local_898._2_1_,
                                                      CONCAT13(local_8a8._1_1_,
                                                               CONCAT12(local_898._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_8a8,
                                                                                 (char)local_168))))
                                            )));
      uStack_cb0 = CONCAT17(local_8a8._7_1_,
                            CONCAT16(local_898._7_1_,
                                     CONCAT15(local_8a8._6_1_,
                                              CONCAT14(local_898._6_1_,
                                                       CONCAT13(local_8a8._5_1_,
                                                                CONCAT12(local_898._5_1_,
                                                                         CONCAT11(local_8a8._4_1_,
                                                                                  local_898._4_1_)))
                                                      ))));
      local_190 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 3));
      local_1a8 = *local_190;
      uStack_1a0 = 0;
      local_1b0 = (undefined8 *)((long)local_d0 + (long)(local_9d4 << 2));
      local_1c8 = *local_1b0;
      uStack_1c0 = 0;
      uStack_8b0 = 0;
      uStack_8c0 = 0;
      local_8b8._1_1_ = (undefined1)((ulong)local_1a8 >> 8);
      local_8b8._2_1_ = (undefined1)((ulong)local_1a8 >> 0x10);
      local_8b8._3_1_ = (undefined1)((ulong)local_1a8 >> 0x18);
      local_8b8._4_1_ = (undefined1)((ulong)local_1a8 >> 0x20);
      local_8b8._5_1_ = (undefined1)((ulong)local_1a8 >> 0x28);
      local_8b8._6_1_ = (undefined1)((ulong)local_1a8 >> 0x30);
      local_8b8._7_1_ = (undefined1)((ulong)local_1a8 >> 0x38);
      local_8c8._0_1_ = (undefined1)local_1c8;
      local_8c8._1_1_ = (undefined1)((ulong)local_1c8 >> 8);
      local_8c8._2_1_ = (undefined1)((ulong)local_1c8 >> 0x10);
      local_8c8._3_1_ = (undefined1)((ulong)local_1c8 >> 0x18);
      local_8c8._4_1_ = (undefined1)((ulong)local_1c8 >> 0x20);
      local_8c8._5_1_ = (undefined1)((ulong)local_1c8 >> 0x28);
      local_8c8._6_1_ = (undefined1)((ulong)local_1c8 >> 0x30);
      local_8c8._7_1_ = (undefined1)((ulong)local_1c8 >> 0x38);
      local_ca8 = CONCAT17(local_8c8._3_1_,
                           CONCAT16(local_8b8._3_1_,
                                    CONCAT15(local_8c8._2_1_,
                                             CONCAT14(local_8b8._2_1_,
                                                      CONCAT13(local_8c8._1_1_,
                                                               CONCAT12(local_8b8._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_8c8,
                                                                                 (char)local_1a8))))
                                            )));
      uStack_ca0 = CONCAT17(local_8c8._7_1_,
                            CONCAT16(local_8b8._7_1_,
                                     CONCAT15(local_8c8._6_1_,
                                              CONCAT14(local_8b8._6_1_,
                                                       CONCAT13(local_8c8._5_1_,
                                                                CONCAT12(local_8b8._5_1_,
                                                                         CONCAT11(local_8c8._4_1_,
                                                                                  local_8b8._4_1_)))
                                                      ))));
      local_1d0 = (undefined8 *)((long)local_d0 + (long)(local_9d4 << 2));
      local_1e8 = *local_1d0;
      uStack_1e0 = 0;
      local_1f0 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 5));
      local_208 = *local_1f0;
      uStack_200 = 0;
      uStack_8d0 = 0;
      uStack_8e0 = 0;
      local_8d8._1_1_ = (undefined1)((ulong)local_1e8 >> 8);
      local_8d8._2_1_ = (undefined1)((ulong)local_1e8 >> 0x10);
      local_8d8._3_1_ = (undefined1)((ulong)local_1e8 >> 0x18);
      local_8d8._4_1_ = (undefined1)((ulong)local_1e8 >> 0x20);
      local_8d8._5_1_ = (undefined1)((ulong)local_1e8 >> 0x28);
      local_8d8._6_1_ = (undefined1)((ulong)local_1e8 >> 0x30);
      local_8d8._7_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
      local_8e8._0_1_ = (undefined1)local_208;
      local_8e8._1_1_ = (undefined1)((ulong)local_208 >> 8);
      local_8e8._2_1_ = (undefined1)((ulong)local_208 >> 0x10);
      local_8e8._3_1_ = (undefined1)((ulong)local_208 >> 0x18);
      local_8e8._4_1_ = (undefined1)((ulong)local_208 >> 0x20);
      local_8e8._5_1_ = (undefined1)((ulong)local_208 >> 0x28);
      local_8e8._6_1_ = (undefined1)((ulong)local_208 >> 0x30);
      local_8e8._7_1_ = (undefined1)((ulong)local_208 >> 0x38);
      local_c98 = CONCAT17(local_8e8._3_1_,
                           CONCAT16(local_8d8._3_1_,
                                    CONCAT15(local_8e8._2_1_,
                                             CONCAT14(local_8d8._2_1_,
                                                      CONCAT13(local_8e8._1_1_,
                                                               CONCAT12(local_8d8._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_8e8,
                                                                                 (char)local_1e8))))
                                            )));
      uStack_c90 = CONCAT17(local_8e8._7_1_,
                            CONCAT16(local_8d8._7_1_,
                                     CONCAT15(local_8e8._6_1_,
                                              CONCAT14(local_8d8._6_1_,
                                                       CONCAT13(local_8e8._5_1_,
                                                                CONCAT12(local_8d8._5_1_,
                                                                         CONCAT11(local_8e8._4_1_,
                                                                                  local_8d8._4_1_)))
                                                      ))));
      local_210 = (undefined8 *)((long)local_d0 + (long)(local_9d4 * 5));
      local_228 = *local_210;
      uStack_220 = 0;
      uStack_8f0 = 0;
      uStack_900 = 0;
      local_8f8._1_1_ = (undefined1)((ulong)local_228 >> 8);
      local_8f8._2_1_ = (undefined1)((ulong)local_228 >> 0x10);
      local_8f8._3_1_ = (undefined1)((ulong)local_228 >> 0x18);
      local_8f8._4_1_ = (undefined1)((ulong)local_228 >> 0x20);
      local_8f8._5_1_ = (undefined1)((ulong)local_228 >> 0x28);
      local_8f8._6_1_ = (undefined1)((ulong)local_228 >> 0x30);
      local_8f8._7_1_ = (undefined1)((ulong)local_228 >> 0x38);
      local_908._0_1_ = (undefined1)local_ce8;
      local_908._1_1_ = (undefined1)((ulong)local_ce8 >> 8);
      local_908._2_1_ = (undefined1)((ulong)local_ce8 >> 0x10);
      local_908._3_1_ = (undefined1)((ulong)local_ce8 >> 0x18);
      local_908._4_1_ = (undefined1)((ulong)local_ce8 >> 0x20);
      local_908._5_1_ = (undefined1)((ulong)local_ce8 >> 0x28);
      local_908._6_1_ = (undefined1)((ulong)local_ce8 >> 0x30);
      local_908._7_1_ = (undefined1)((ulong)local_ce8 >> 0x38);
      local_c88 = CONCAT17(local_908._3_1_,
                           CONCAT16(local_8f8._3_1_,
                                    CONCAT15(local_908._2_1_,
                                             CONCAT14(local_8f8._2_1_,
                                                      CONCAT13(local_908._1_1_,
                                                               CONCAT12(local_8f8._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_908,
                                                                                 (char)local_228))))
                                            )));
      uStack_c80 = CONCAT17(local_908._7_1_,
                            CONCAT16(local_8f8._7_1_,
                                     CONCAT15(local_908._6_1_,
                                              CONCAT14(local_8f8._6_1_,
                                                       CONCAT13(local_908._5_1_,
                                                                CONCAT12(local_8f8._5_1_,
                                                                         CONCAT11(local_908._4_1_,
                                                                                  local_8f8._4_1_)))
                                                      ))));
      local_d34 = 0;
      local_908 = local_ce8;
      local_8f8 = local_228;
      local_8e8 = local_208;
      local_8d8 = local_1e8;
      local_8c8 = local_1c8;
      local_8b8 = local_1a8;
      local_8a8 = local_188;
      local_898 = local_168;
      local_888 = local_148;
      local_878 = local_128;
      local_868 = local_108;
      local_858 = local_e8;
      local_c8 = local_ce8;
      do {
        local_d30 = (long)local_a08 + (long)(local_d34 * local_9d4 + local_c4c);
        local_230 = (undefined8 *)(local_d30 + local_9d4 * 7);
        local_248 = *local_230;
        uStack_240 = 0;
        local_918 = local_ce8;
        uVar32 = local_918;
        uStack_910 = uStack_ce0;
        uStack_920 = 0;
        local_918._0_1_ = (undefined1)local_ce8;
        local_918._1_1_ = (undefined1)((ulong)local_ce8 >> 8);
        local_918._2_1_ = (undefined1)((ulong)local_ce8 >> 0x10);
        local_918._3_1_ = (undefined1)((ulong)local_ce8 >> 0x18);
        local_918._4_1_ = (undefined1)((ulong)local_ce8 >> 0x20);
        local_918._5_1_ = (undefined1)((ulong)local_ce8 >> 0x28);
        local_918._6_1_ = (undefined1)((ulong)local_ce8 >> 0x30);
        local_918._7_1_ = (undefined1)((ulong)local_ce8 >> 0x38);
        local_928._0_1_ = (undefined1)local_248;
        local_928._1_1_ = (undefined1)((ulong)local_248 >> 8);
        local_928._2_1_ = (undefined1)((ulong)local_248 >> 0x10);
        local_928._3_1_ = (undefined1)((ulong)local_248 >> 0x18);
        local_928._4_1_ = (undefined1)((ulong)local_248 >> 0x20);
        local_928._5_1_ = (undefined1)((ulong)local_248 >> 0x28);
        local_928._6_1_ = (undefined1)((ulong)local_248 >> 0x30);
        local_928._7_1_ = (undefined1)((ulong)local_248 >> 0x38);
        local_c78 = (undefined1)local_918;
        uStack_c77 = (undefined1)local_928;
        uStack_c76 = local_918._1_1_;
        uStack_c75 = local_928._1_1_;
        uStack_c74 = local_918._2_1_;
        uStack_c73 = local_928._2_1_;
        uStack_c72 = local_918._3_1_;
        uStack_c71 = local_928._3_1_;
        uStack_c70 = local_918._4_1_;
        uStack_c6f = local_928._4_1_;
        uStack_c6e = local_918._5_1_;
        uStack_c6d = local_928._5_1_;
        uStack_c6c = local_918._6_1_;
        uStack_c6b = local_928._6_1_;
        uStack_c6a = local_918._7_1_;
        uStack_c69 = local_928._7_1_;
        local_250 = (undefined8 *)(local_d30 + (local_9d4 << 3));
        local_ce8 = *local_250;
        uStack_260 = 0;
        uStack_ce0 = 0;
        local_270 = (undefined8 *)(local_d30 + local_9d4 * 7);
        local_288 = *local_270;
        uStack_280 = 0;
        uStack_930 = 0;
        uStack_940 = 0;
        local_938._0_1_ = (undefined1)local_288;
        local_938._1_1_ = (undefined1)((ulong)local_288 >> 8);
        local_938._2_1_ = (undefined1)((ulong)local_288 >> 0x10);
        local_938._3_1_ = (undefined1)((ulong)local_288 >> 0x18);
        local_938._4_1_ = (undefined1)((ulong)local_288 >> 0x20);
        local_938._5_1_ = (undefined1)((ulong)local_288 >> 0x28);
        local_938._6_1_ = (undefined1)((ulong)local_288 >> 0x30);
        local_938._7_1_ = (undefined1)((ulong)local_288 >> 0x38);
        local_948._0_1_ = (undefined1)local_ce8;
        local_948._1_1_ = (undefined1)((ulong)local_ce8 >> 8);
        local_948._2_1_ = (undefined1)((ulong)local_ce8 >> 0x10);
        local_948._3_1_ = (undefined1)((ulong)local_ce8 >> 0x18);
        local_948._4_1_ = (undefined1)((ulong)local_ce8 >> 0x20);
        local_948._5_1_ = (undefined1)((ulong)local_ce8 >> 0x28);
        local_948._6_1_ = (undefined1)((ulong)local_ce8 >> 0x30);
        local_948._7_1_ = (undefined1)((ulong)local_ce8 >> 0x38);
        local_c68 = (undefined1)local_938;
        uStack_c67 = (undefined1)local_948;
        uStack_c66 = local_938._1_1_;
        uStack_c65 = local_948._1_1_;
        uStack_c64 = local_938._2_1_;
        uStack_c63 = local_948._2_1_;
        uStack_c62 = local_938._3_1_;
        uStack_c61 = local_948._3_1_;
        uStack_c60 = local_938._4_1_;
        uStack_c5f = local_948._4_1_;
        uStack_c5e = local_938._5_1_;
        uStack_c5d = local_948._5_1_;
        uStack_c5c = local_938._6_1_;
        uStack_c5b = local_948._6_1_;
        uStack_c5a = local_938._7_1_;
        uStack_c59 = local_948._7_1_;
        local_948 = local_ce8;
        local_938 = local_288;
        local_928 = local_248;
        local_918 = uVar32;
        local_268 = local_ce8;
        convolve_lo_y(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
        local_cf8 = extraout_XMM0_Qa_18;
        uStack_cf0 = extraout_XMM0_Qb_06;
        convolve_hi_y(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
        local_558 = local_cf8;
        uVar26 = local_558;
        uStack_550 = uStack_cf0;
        uVar27 = uStack_550;
        local_568 = local_a28;
        uVar24 = local_568;
        uStack_560 = uStack_a20;
        uVar25 = uStack_560;
        local_558._0_4_ = (int)local_cf8;
        local_558._4_4_ = (int)((ulong)local_cf8 >> 0x20);
        uStack_550._0_4_ = (int)uStack_cf0;
        uStack_550._4_4_ = (int)((ulong)uStack_cf0 >> 0x20);
        local_568._0_4_ = (int)local_a28;
        local_568._4_4_ = (int)(local_a28 >> 0x20);
        uStack_560._0_4_ = (int)uStack_a20;
        uStack_560._4_4_ = (int)((ulong)uStack_a20 >> 0x20);
        local_588 = local_a28;
        uStack_580 = uStack_a20;
        local_578 = (int)extraout_XMM0_Qa_19;
        iStack_574 = (int)((ulong)extraout_XMM0_Qa_19 >> 0x20);
        iStack_570 = (int)extraout_XMM0_Qb_07;
        iStack_56c = (int)((ulong)extraout_XMM0_Qb_07 >> 0x20);
        local_618 = CONCAT44(local_558._4_4_ << local_568._4_4_,(int)local_558 << (int)local_568);
        uStack_610 = CONCAT44(uStack_550._4_4_ << uStack_560._4_4_,
                              (int)uStack_550 << (int)uStack_560);
        local_628 = local_aa8;
        uVar32 = local_628;
        uStack_620 = uStack_aa0;
        uVar23 = uStack_620;
        local_628._0_4_ = (int)local_aa8;
        local_628._4_4_ = (int)((ulong)local_aa8 >> 0x20);
        uStack_620._0_4_ = (int)uStack_aa0;
        uStack_620._4_4_ = (int)((ulong)uStack_aa0 >> 0x20);
        local_6d8 = ((int)local_558 << (int)local_568) + (int)local_628;
        iStack_6d4 = (local_558._4_4_ << local_568._4_4_) + local_628._4_4_;
        iStack_6d0 = ((int)uStack_550 << (int)uStack_560) + (int)uStack_620;
        iStack_6cc = (uStack_550._4_4_ << uStack_560._4_4_) + uStack_620._4_4_;
        local_6e8 = local_ab8;
        uStack_6e0 = uStack_ab0;
        auVar11._8_8_ = uStack_ab0;
        auVar11._0_8_ = local_ab8;
        local_d18 = local_6d8 >> auVar11;
        iStack_d14 = iStack_6d4 >> auVar11;
        iStack_d10 = iStack_6d0 >> auVar11;
        iStack_d0c = iStack_6cc >> auVar11;
        local_638 = CONCAT44(iStack_574 << local_568._4_4_,local_578 << (int)local_568);
        uStack_630 = CONCAT44(iStack_56c << uStack_560._4_4_,iStack_570 << (int)uStack_560);
        local_648 = local_aa8;
        uStack_640 = uStack_aa0;
        local_6f8 = (local_578 << (int)local_568) + (int)local_628;
        iStack_6f4 = (iStack_574 << local_568._4_4_) + local_628._4_4_;
        iStack_6f0 = (iStack_570 << (int)uStack_560) + (int)uStack_620;
        iStack_6ec = (iStack_56c << uStack_560._4_4_) + uStack_620._4_4_;
        local_708 = local_ab8;
        uStack_700 = uStack_ab0;
        auVar10._8_8_ = uStack_ab0;
        auVar10._0_8_ = local_ab8;
        local_d28 = local_6f8 >> auVar10;
        iStack_d24 = iStack_6f4 >> auVar10;
        iStack_d20 = iStack_6f0 >> auVar10;
        iStack_d1c = iStack_6ec >> auVar10;
        local_4d8 = CONCAT44(iStack_d14,local_d18);
        uStack_4d0 = CONCAT44(iStack_d0c,iStack_d10);
        local_4e8 = CONCAT44(iStack_d24,local_d28);
        uStack_4e0 = CONCAT44(iStack_d1c,iStack_d20);
        auVar17._8_8_ = uStack_4d0;
        auVar17._0_8_ = local_4d8;
        auVar16._8_8_ = uStack_4e0;
        auVar16._0_8_ = local_4e8;
        local_d48 = packssdw(auVar17,auVar16);
        local_458 = local_d48._0_8_;
        uVar30 = local_458;
        uStack_450 = local_d48._8_8_;
        uVar31 = uStack_450;
        local_468 = local_a78;
        lVar28 = local_468;
        uStack_460 = lStack_a70;
        lVar29 = uStack_460;
        local_458._0_2_ = local_d48._0_2_;
        local_458._2_2_ = local_d48._2_2_;
        local_458._4_2_ = local_d48._4_2_;
        local_458._6_2_ = local_d48._6_2_;
        uStack_450._0_2_ = local_d48._8_2_;
        uStack_450._2_2_ = local_d48._10_2_;
        uStack_450._4_2_ = local_d48._12_2_;
        uStack_450._6_2_ = local_d48._14_2_;
        local_468._0_2_ = (short)local_a78;
        local_468._2_2_ = (short)((ulong)local_a78 >> 0x10);
        local_468._4_2_ = (short)((ulong)local_a78 >> 0x20);
        local_468._6_2_ = (short)((ulong)local_a78 >> 0x30);
        uStack_460._0_2_ = (short)lStack_a70;
        uStack_460._2_2_ = (short)((ulong)lStack_a70 >> 0x10);
        uStack_460._4_2_ = (short)((ulong)lStack_a70 >> 0x20);
        uStack_460._6_2_ = (short)((ulong)lStack_a70 >> 0x30);
        local_d58 = (short)local_458 + (short)local_468;
        sStack_d56 = local_458._2_2_ + local_468._2_2_;
        sStack_d54 = local_458._4_2_ + local_468._4_2_;
        sStack_d52 = local_458._6_2_ + local_468._6_2_;
        sStack_d50 = (short)uStack_450 + (short)uStack_460;
        sStack_d4e = uStack_450._2_2_ + uStack_460._2_2_;
        sStack_d4c = uStack_450._4_2_ + uStack_460._4_2_;
        sStack_d4a = uStack_450._6_2_ + uStack_460._6_2_;
        local_628 = uVar32;
        uStack_620 = uVar23;
        local_568 = uVar24;
        uStack_560 = uVar25;
        local_558 = uVar26;
        uStack_550 = uVar27;
        local_468 = lVar28;
        uStack_460 = lVar29;
        local_458 = uVar30;
        uStack_450 = uVar31;
        if (local_a5c == 0) {
          local_310 = (undefined8 *)
                      ((long)local_9f8 + (long)(local_d34 * local_9fc + local_c4c) * 2);
          local_328 = CONCAT26(sStack_d52,CONCAT24(sStack_d54,CONCAT22(sStack_d56,local_d58)));
          uStack_320 = CONCAT26(sStack_d4a,CONCAT24(sStack_d4c,CONCAT22(sStack_d4e,sStack_d50)));
          *local_310 = local_328;
          local_310[1] = uStack_320;
        }
        else {
          local_960 = (undefined8 *)
                      ((long)local_9f8 + (long)(local_d34 * local_9fc + local_c4c) * 2);
          local_d68 = *local_960;
          uStack_d60 = local_960[1];
          comp_avg(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,0);
          convolve_rounding(&local_d78,(__m128i *)&local_a78,(__m128i *)&local_a98,local_a7c);
          local_3d8 = (short)extraout_XMM0_Qa_20;
          sStack_3d6 = (short)((ulong)extraout_XMM0_Qa_20 >> 0x10);
          sStack_3d4 = (short)((ulong)extraout_XMM0_Qa_20 >> 0x20);
          sStack_3d2 = (short)((ulong)extraout_XMM0_Qa_20 >> 0x30);
          sStack_3d0 = (short)extraout_XMM0_Qb_08;
          sStack_3ce = (short)((ulong)extraout_XMM0_Qb_08 >> 0x10);
          sStack_3cc = (short)((ulong)extraout_XMM0_Qb_08 >> 0x20);
          sStack_3ca = (short)((ulong)extraout_XMM0_Qb_08 >> 0x30);
          local_d98 = (0 < local_3d8) * (local_3d8 < 0x100) * (char)extraout_XMM0_Qa_20 -
                      (0xff < local_3d8);
          cVar1 = (char)((ulong)extraout_XMM0_Qa_20 >> 0x10);
          cStack_d97 = (0 < sStack_3d6) * (sStack_3d6 < 0x100) * cVar1 - (0xff < sStack_3d6);
          cVar2 = (char)((ulong)extraout_XMM0_Qa_20 >> 0x20);
          cStack_d96 = (0 < sStack_3d4) * (sStack_3d4 < 0x100) * cVar2 - (0xff < sStack_3d4);
          cVar3 = (char)((ulong)extraout_XMM0_Qa_20 >> 0x30);
          cStack_d95 = (0 < sStack_3d2) * (sStack_3d2 < 0x100) * cVar3 - (0xff < sStack_3d2);
          cStack_d94 = (0 < sStack_3d0) * (sStack_3d0 < 0x100) * (char)extraout_XMM0_Qb_08 -
                       (0xff < sStack_3d0);
          cVar4 = (char)((ulong)extraout_XMM0_Qb_08 >> 0x10);
          cStack_d93 = (0 < sStack_3ce) * (sStack_3ce < 0x100) * cVar4 - (0xff < sStack_3ce);
          cVar5 = (char)((ulong)extraout_XMM0_Qb_08 >> 0x20);
          cStack_d92 = (0 < sStack_3cc) * (sStack_3cc < 0x100) * cVar5 - (0xff < sStack_3cc);
          cVar6 = (char)((ulong)extraout_XMM0_Qb_08 >> 0x30);
          cStack_d91 = (0 < sStack_3ca) * (sStack_3ca < 0x100) * cVar6 - (0xff < sStack_3ca);
          cStack_d90 = (0 < local_3d8) * (local_3d8 < 0x100) * (char)extraout_XMM0_Qa_20 -
                       (0xff < local_3d8);
          cStack_d8f = (0 < sStack_3d6) * (sStack_3d6 < 0x100) * cVar1 - (0xff < sStack_3d6);
          cStack_d8e = (0 < sStack_3d4) * (sStack_3d4 < 0x100) * cVar2 - (0xff < sStack_3d4);
          cStack_d8d = (0 < sStack_3d2) * (sStack_3d2 < 0x100) * cVar3 - (0xff < sStack_3d2);
          cStack_d8c = (0 < sStack_3d0) * (sStack_3d0 < 0x100) * (char)extraout_XMM0_Qb_08 -
                       (0xff < sStack_3d0);
          cStack_d8b = (0 < sStack_3ce) * (sStack_3ce < 0x100) * cVar4 - (0xff < sStack_3ce);
          cStack_d8a = (0 < sStack_3cc) * (sStack_3cc < 0x100) * cVar5 - (0xff < sStack_3cc);
          cStack_d89 = (0 < sStack_3ca) * (sStack_3ca < 0x100) * cVar6 - (0xff < sStack_3ca);
          local_290 = (undefined8 *)((long)local_9e0 + (long)(local_d34 * local_9e4 + local_c4c));
          local_2a8 = CONCAT17(cStack_d91,
                               CONCAT16(cStack_d92,
                                        CONCAT15(cStack_d93,
                                                 CONCAT14(cStack_d94,
                                                          CONCAT13(cStack_d95,
                                                                   CONCAT12(cStack_d96,
                                                                            CONCAT11(cStack_d97,
                                                                                     local_d98))))))
                              );
          uStack_2a0 = CONCAT17(cStack_d89,
                                CONCAT16(cStack_d8a,
                                         CONCAT15(cStack_d8b,
                                                  CONCAT14(cStack_d8c,
                                                           CONCAT13(cStack_d8d,
                                                                    CONCAT12(cStack_d8e,
                                                                             CONCAT11(cStack_d8f,
                                                                                      cStack_d90))))
                                                 )));
          *local_290 = local_2a8;
        }
        local_d34 = local_d34 + 1;
        convolve_lo_y(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
        local_cf8 = extraout_XMM0_Qa_21;
        uStack_cf0 = extraout_XMM0_Qb_09;
        convolve_hi_y(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
        local_598 = local_cf8;
        uVar26 = local_598;
        uStack_590 = uStack_cf0;
        uVar27 = uStack_590;
        local_5a8 = local_a28;
        uVar24 = local_5a8;
        uStack_5a0 = uStack_a20;
        uVar25 = uStack_5a0;
        local_598._0_4_ = (int)local_cf8;
        local_598._4_4_ = (int)((ulong)local_cf8 >> 0x20);
        uStack_590._0_4_ = (int)uStack_cf0;
        uStack_590._4_4_ = (int)((ulong)uStack_cf0 >> 0x20);
        local_5a8._0_4_ = (int)local_a28;
        local_5a8._4_4_ = (int)(local_a28 >> 0x20);
        uStack_5a0._0_4_ = (int)uStack_a20;
        uStack_5a0._4_4_ = (int)((ulong)uStack_a20 >> 0x20);
        local_5c8 = local_a28;
        uStack_5c0 = uStack_a20;
        local_5b8 = (int)extraout_XMM0_Qa_22;
        iStack_5b4 = (int)((ulong)extraout_XMM0_Qa_22 >> 0x20);
        iStack_5b0 = (int)extraout_XMM0_Qb_10;
        iStack_5ac = (int)((ulong)extraout_XMM0_Qb_10 >> 0x20);
        local_658 = CONCAT44(local_598._4_4_ << local_5a8._4_4_,(int)local_598 << (int)local_5a8);
        uStack_650 = CONCAT44(uStack_590._4_4_ << uStack_5a0._4_4_,
                              (int)uStack_590 << (int)uStack_5a0);
        local_668 = local_aa8;
        uVar32 = local_668;
        uStack_660 = uStack_aa0;
        uVar23 = uStack_660;
        local_668._0_4_ = (int)local_aa8;
        local_668._4_4_ = (int)((ulong)local_aa8 >> 0x20);
        uStack_660._0_4_ = (int)uStack_aa0;
        uStack_660._4_4_ = (int)((ulong)uStack_aa0 >> 0x20);
        local_718 = ((int)local_598 << (int)local_5a8) + (int)local_668;
        iStack_714 = (local_598._4_4_ << local_5a8._4_4_) + local_668._4_4_;
        iStack_710 = ((int)uStack_590 << (int)uStack_5a0) + (int)uStack_660;
        iStack_70c = (uStack_590._4_4_ << uStack_5a0._4_4_) + uStack_660._4_4_;
        local_728 = local_ab8;
        uStack_720 = uStack_ab0;
        auVar9._8_8_ = uStack_ab0;
        auVar9._0_8_ = local_ab8;
        local_d18 = local_718 >> auVar9;
        iStack_d14 = iStack_714 >> auVar9;
        iStack_d10 = iStack_710 >> auVar9;
        iStack_d0c = iStack_70c >> auVar9;
        local_678 = CONCAT44(iStack_5b4 << local_5a8._4_4_,local_5b8 << (int)local_5a8);
        uStack_670 = CONCAT44(iStack_5ac << uStack_5a0._4_4_,iStack_5b0 << (int)uStack_5a0);
        local_688 = local_aa8;
        uStack_680 = uStack_aa0;
        local_738 = (local_5b8 << (int)local_5a8) + (int)local_668;
        iStack_734 = (iStack_5b4 << local_5a8._4_4_) + local_668._4_4_;
        iStack_730 = (iStack_5b0 << (int)uStack_5a0) + (int)uStack_660;
        iStack_72c = (iStack_5ac << uStack_5a0._4_4_) + uStack_660._4_4_;
        local_748 = local_ab8;
        uStack_740 = uStack_ab0;
        auVar8._8_8_ = uStack_ab0;
        auVar8._0_8_ = local_ab8;
        local_d28 = local_738 >> auVar8;
        iStack_d24 = iStack_734 >> auVar8;
        iStack_d20 = iStack_730 >> auVar8;
        iStack_d1c = iStack_72c >> auVar8;
        local_4f8 = CONCAT44(iStack_d14,local_d18);
        uStack_4f0 = CONCAT44(iStack_d0c,iStack_d10);
        local_508 = CONCAT44(iStack_d24,local_d28);
        uStack_500 = CONCAT44(iStack_d1c,iStack_d20);
        auVar15._8_8_ = uStack_4f0;
        auVar15._0_8_ = local_4f8;
        auVar14._8_8_ = uStack_500;
        auVar14._0_8_ = local_508;
        local_d48 = packssdw(auVar15,auVar14);
        local_478 = local_d48._0_8_;
        uVar30 = local_478;
        uStack_470 = local_d48._8_8_;
        uVar31 = uStack_470;
        local_488 = local_a78;
        lVar28 = local_488;
        uStack_480 = lStack_a70;
        lVar29 = uStack_480;
        local_478._0_2_ = local_d48._0_2_;
        local_478._2_2_ = local_d48._2_2_;
        local_478._4_2_ = local_d48._4_2_;
        local_478._6_2_ = local_d48._6_2_;
        uStack_470._0_2_ = local_d48._8_2_;
        uStack_470._2_2_ = local_d48._10_2_;
        uStack_470._4_2_ = local_d48._12_2_;
        uStack_470._6_2_ = local_d48._14_2_;
        local_488._0_2_ = (short)local_a78;
        local_488._2_2_ = (short)((ulong)local_a78 >> 0x10);
        local_488._4_2_ = (short)((ulong)local_a78 >> 0x20);
        local_488._6_2_ = (short)((ulong)local_a78 >> 0x30);
        uStack_480._0_2_ = (short)lStack_a70;
        uStack_480._2_2_ = (short)((ulong)lStack_a70 >> 0x10);
        uStack_480._4_2_ = (short)((ulong)lStack_a70 >> 0x20);
        uStack_480._6_2_ = (short)((ulong)lStack_a70 >> 0x30);
        local_d58 = (short)local_478 + (short)local_488;
        sStack_d56 = local_478._2_2_ + local_488._2_2_;
        sStack_d54 = local_478._4_2_ + local_488._4_2_;
        sStack_d52 = local_478._6_2_ + local_488._6_2_;
        sStack_d50 = (short)uStack_470 + (short)uStack_480;
        sStack_d4e = uStack_470._2_2_ + uStack_480._2_2_;
        sStack_d4c = uStack_470._4_2_ + uStack_480._4_2_;
        sStack_d4a = uStack_470._6_2_ + uStack_480._6_2_;
        local_668 = uVar32;
        uStack_660 = uVar23;
        local_5a8 = uVar24;
        uStack_5a0 = uVar25;
        local_598 = uVar26;
        uStack_590 = uVar27;
        local_488 = lVar28;
        uStack_480 = lVar29;
        local_478 = uVar30;
        uStack_470 = uVar31;
        if (local_a5c == 0) {
          local_330 = (undefined8 *)
                      ((long)local_9f8 + (long)(local_d34 * local_9fc + local_c4c) * 2);
          local_348 = CONCAT26(sStack_d52,CONCAT24(sStack_d54,CONCAT22(sStack_d56,local_d58)));
          uStack_340 = CONCAT26(sStack_d4a,CONCAT24(sStack_d4c,CONCAT22(sStack_d4e,sStack_d50)));
          *local_330 = local_348;
          local_330[1] = uStack_340;
        }
        else {
          local_968 = (undefined8 *)
                      ((long)local_9f8 + (long)(local_d34 * local_9fc + local_c4c) * 2);
          local_da8 = *local_968;
          uStack_da0 = local_968[1];
          comp_avg(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,0);
          convolve_rounding(&local_db8,(__m128i *)&local_a78,(__m128i *)&local_a98,local_a7c);
          local_3f8 = (short)extraout_XMM0_Qa_23;
          sStack_3f6 = (short)((ulong)extraout_XMM0_Qa_23 >> 0x10);
          sStack_3f4 = (short)((ulong)extraout_XMM0_Qa_23 >> 0x20);
          sStack_3f2 = (short)((ulong)extraout_XMM0_Qa_23 >> 0x30);
          sStack_3f0 = (short)extraout_XMM0_Qb_11;
          sStack_3ee = (short)((ulong)extraout_XMM0_Qb_11 >> 0x10);
          sStack_3ec = (short)((ulong)extraout_XMM0_Qb_11 >> 0x20);
          sStack_3ea = (short)((ulong)extraout_XMM0_Qb_11 >> 0x30);
          cVar1 = (char)((ulong)extraout_XMM0_Qa_23 >> 0x10);
          cVar2 = (char)((ulong)extraout_XMM0_Qa_23 >> 0x20);
          cVar3 = (char)((ulong)extraout_XMM0_Qa_23 >> 0x30);
          cVar4 = (char)((ulong)extraout_XMM0_Qb_11 >> 0x10);
          cVar5 = (char)((ulong)extraout_XMM0_Qb_11 >> 0x20);
          cVar6 = (char)((ulong)extraout_XMM0_Qb_11 >> 0x30);
          local_2b0 = (undefined8 *)((long)local_9e0 + (long)(local_d34 * local_9e4 + local_c4c));
          local_2c8 = CONCAT17((0 < sStack_3ea) * (sStack_3ea < 0x100) * cVar6 - (0xff < sStack_3ea)
                               ,CONCAT16((0 < sStack_3ec) * (sStack_3ec < 0x100) * cVar5 -
                                         (0xff < sStack_3ec),
                                         CONCAT15((0 < sStack_3ee) * (sStack_3ee < 0x100) * cVar4 -
                                                  (0xff < sStack_3ee),
                                                  CONCAT14((0 < sStack_3f0) * (sStack_3f0 < 0x100) *
                                                           (char)extraout_XMM0_Qb_11 -
                                                           (0xff < sStack_3f0),
                                                           CONCAT13((0 < sStack_3f2) *
                                                                    (sStack_3f2 < 0x100) * cVar3 -
                                                                    (0xff < sStack_3f2),
                                                                    CONCAT12((0 < sStack_3f4) *
                                                                             (sStack_3f4 < 0x100) *
                                                                             cVar2 - (0xff < 
                                                  sStack_3f4),
                                                  CONCAT11((0 < sStack_3f6) * (sStack_3f6 < 0x100) *
                                                           cVar1 - (0xff < sStack_3f6),
                                                           (0 < local_3f8) * (local_3f8 < 0x100) *
                                                           (char)extraout_XMM0_Qa_23 -
                                                           (0xff < local_3f8))))))));
          uStack_2c0 = CONCAT17((0 < sStack_3ea) * (sStack_3ea < 0x100) * cVar6 -
                                (0xff < sStack_3ea),
                                CONCAT16((0 < sStack_3ec) * (sStack_3ec < 0x100) * cVar5 -
                                         (0xff < sStack_3ec),
                                         CONCAT15((0 < sStack_3ee) * (sStack_3ee < 0x100) * cVar4 -
                                                  (0xff < sStack_3ee),
                                                  CONCAT14((0 < sStack_3f0) * (sStack_3f0 < 0x100) *
                                                           (char)extraout_XMM0_Qb_11 -
                                                           (0xff < sStack_3f0),
                                                           CONCAT13((0 < sStack_3f2) *
                                                                    (sStack_3f2 < 0x100) * cVar3 -
                                                                    (0xff < sStack_3f2),
                                                                    CONCAT12((0 < sStack_3f4) *
                                                                             (sStack_3f4 < 0x100) *
                                                                             cVar2 - (0xff < 
                                                  sStack_3f4),
                                                  CONCAT11((0 < sStack_3f6) * (sStack_3f6 < 0x100) *
                                                           cVar1 - (0xff < sStack_3f6),
                                                           (0 < local_3f8) * (local_3f8 < 0x100) *
                                                           (char)extraout_XMM0_Qa_23 -
                                                           (0xff < local_3f8))))))));
          *local_2b0 = local_2c8;
        }
        local_d34 = local_d34 + 1;
        local_cd8 = local_cb8;
        uStack_cd0 = uStack_cb0;
        local_cc8 = local_ca8;
        uStack_cc0 = uStack_ca0;
        local_cb8 = local_c98;
        uStack_cb0 = uStack_c90;
        local_ca8 = local_c88;
        uStack_ca0 = uStack_c80;
        local_c98 = CONCAT17(uStack_c71,
                             CONCAT16(uStack_c72,
                                      CONCAT15(uStack_c73,
                                               CONCAT14(uStack_c74,
                                                        CONCAT13(uStack_c75,
                                                                 CONCAT12(uStack_c76,
                                                                          CONCAT11(uStack_c77,
                                                                                   local_c78)))))));
        uStack_c90 = CONCAT17(uStack_c69,
                              CONCAT16(uStack_c6a,
                                       CONCAT15(uStack_c6b,
                                                CONCAT14(uStack_c6c,
                                                         CONCAT13(uStack_c6d,
                                                                  CONCAT12(uStack_c6e,
                                                                           CONCAT11(uStack_c6f,
                                                                                    uStack_c70))))))
                             );
        local_c88 = CONCAT17(uStack_c61,
                             CONCAT16(uStack_c62,
                                      CONCAT15(uStack_c63,
                                               CONCAT14(uStack_c64,
                                                        CONCAT13(uStack_c65,
                                                                 CONCAT12(uStack_c66,
                                                                          CONCAT11(uStack_c67,
                                                                                   local_c68)))))));
        uStack_c80 = CONCAT17(uStack_c59,
                              CONCAT16(uStack_c5a,
                                       CONCAT15(uStack_c5b,
                                                CONCAT14(uStack_c5c,
                                                         CONCAT13(uStack_c5d,
                                                                  CONCAT12(uStack_c5e,
                                                                           CONCAT11(uStack_c5f,
                                                                                    uStack_c60))))))
                             );
      } while (local_d34 < local_9ec);
      local_c4c = local_c4c + 8;
    } while (local_c4c < local_9e8);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i wt0 = _mm_set1_epi16(conv_params->fwd_offset);
  const __m128i wt1 = _mm_set1_epi16(conv_params->bck_offset);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

  if (w == 4) {
    __m128i s[8], src6, res, res_shift;
    s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                             xx_loadl_32(src_ptr + 1 * src_stride));
    s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                             xx_loadl_32(src_ptr + 2 * src_stride));
    s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                             xx_loadl_32(src_ptr + 3 * src_stride));
    s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                             xx_loadl_32(src_ptr + 4 * src_stride));
    s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                             xx_loadl_32(src_ptr + 5 * src_stride));
    src6 = xx_loadl_32(src_ptr + 6 * src_stride);
    s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

    do {
      s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
      src6 = xx_loadl_32(src_ptr + 8 * src_stride);
      s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

      res = convolve_lo_y(s + 0, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      __m128i res_16b = _mm_packs_epi32(res_shift, res_shift);
      __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      res = convolve_lo_y(s + 1, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      res_16b = _mm_packs_epi32(res_shift, res_shift);
      res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
      s[3] = s[5];
      s[4] = s[6];
      s[5] = s[7];
      h -= 2;
    } while (h);
  } else {
    assert(!(w % 8));
    int j = 0;
    do {
      __m128i s[8], src6, res_lo, res_hi, res_lo_shift, res_hi_shift;
      const uint8_t *data = &src_ptr[j];

      src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
      s[0] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
      s[1] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
      s[2] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
      s[3] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
      s[4] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
      s[5] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

      int i = 0;
      do {
        data = &src_ptr[i * src_stride + j];
        s[6] = _mm_unpacklo_epi8(
            src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
        src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
        s[7] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

        res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);

        __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);
        res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
      } while (i < h);
      j += 8;
    } while (j < w);
  }
}